

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O0

void draw_demo_menu(DEMO_MENU *menu)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  long in_RDI;
  ALLEGRO_FONT *pAVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  int tmp;
  int w;
  int h;
  int y;
  int x;
  int i;
  int local_1c;
  int local_18;
  int local_14;
  int local_c;
  
  draw_background();
  draw_credits();
  uVar2 = screen_width / 2;
  iVar4 = screen_height / 6;
  iVar3 = al_get_font_line_height(demo_data[2].dat);
  uVar5 = iVar4 - iVar3 / 2;
  pvVar1 = demo_data[2].dat;
  iVar4 = 0x3e000000;
  pAVar6 = (ALLEGRO_FONT *)al_map_rgba_f(0x3e000000,0x3e000000,0x3e000000,0x3e800000);
  demo_textprintf_centre
            (pAVar6,iVar4,(int)pvVar1,(ulong)(uVar2 + 6),(char *)(ulong)(uVar5 + 5),
             draw_demo_menu::logo_text);
  pvVar1 = demo_data[2].dat;
  iVar4 = 0x3f800000;
  pAVar6 = (ALLEGRO_FONT *)al_map_rgb_f(0x3f800000);
  demo_textprintf_centre
            (pAVar6,iVar4,(int)pvVar1,(ulong)uVar2,(char *)(ulong)uVar5,draw_demo_menu::logo_text);
  local_c = 0;
  local_18 = 0;
  while (*(long *)(in_RDI + (long)local_c * 0x38) != 0) {
    iVar4 = (**(code **)(in_RDI + (long)local_c * 0x38))(in_RDI + (long)local_c * 0x38,5,0);
    local_18 = iVar4 + local_18;
    local_c = local_c + 1;
  }
  local_18 = local_18 + 0x10;
  local_14 = (screen_height * 3) / 5 - local_18 / 2;
  local_1c = 0;
  local_c = 0;
  while (*(long *)(in_RDI + (long)local_c * 0x38) != 0) {
    iVar4 = (**(code **)(in_RDI + (long)local_c * 0x38))(in_RDI + (long)local_c * 0x38,4,0);
    *(int *)(in_RDI + (long)local_c * 0x38 + 0x30) = iVar4;
    *(int *)(in_RDI + (long)local_c * 0x38 + 0x28) = (screen_width - iVar4) / 2;
    if (local_1c < iVar4) {
      local_1c = iVar4;
    }
    local_c = local_c + 1;
  }
  local_1c = local_1c + 0x10;
  if (local_1c < screen_width / 3) {
    local_1c = screen_width / 3;
  }
  if (screen_width < local_1c) {
    local_1c = screen_width;
  }
  iVar4 = (screen_width - local_1c) / 2;
  uVar8 = 0x3e810625;
  uVar7 = al_map_rgba_f(0x3e6353f8,0x3e810625,0x3e8a3d71,0x3f19999a);
  uVar9 = (ulong)(uint)(float)local_14;
  al_draw_filled_rectangle
            ((float)iVar4,uVar9,(float)(iVar4 + local_1c),(float)(local_14 + local_18),uVar7,uVar8);
  uVar7 = al_map_rgb(0,0);
  al_draw_rectangle((float)iVar4,(float)local_14,(float)(iVar4 + local_1c),
                    (float)(local_14 + local_18),uVar7,uVar9,0x3f800000);
  local_14 = local_14 + 8;
  local_c = 0;
  while (*(long *)(in_RDI + (long)local_c * 0x38) != 0) {
    (**(code **)(in_RDI + (long)local_c * 0x38))(in_RDI + (long)local_c * 0x38,1,local_14);
    *(int *)(in_RDI + (long)local_c * 0x38 + 0x2c) = local_14;
    iVar4 = (**(code **)(in_RDI + (long)local_c * 0x38))(in_RDI + (long)local_c * 0x38,5,0);
    *(int *)(in_RDI + (long)local_c * 0x38 + 0x34) = iVar4;
    local_14 = iVar4 + local_14;
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void draw_demo_menu(DEMO_MENU * menu)
{
   int i, x, y, h, w;
   int tmp;
   static char logo_text[] = "Demo Game";

   draw_background();
   draw_credits();

   x = screen_width / 2;
   y = 1 * screen_height / 6 - al_get_font_line_height(demo_font_logo) / 2;
   demo_textprintf_centre(demo_font_logo, x + 6, y + 5,
                        al_map_rgba_f(0.125, 0.125, 0.125, 0.25), logo_text);
   demo_textprintf_centre(demo_font_logo, x, y, al_map_rgb_f(1, 1, 1), logo_text);

   /* calculate height of the whole menu and the starting y coordinate */
   h = 0;
   for (i = 0, h = 0; menu[i].proc != NULL; i++) {
      h += menu[i].proc(&menu[i], DEMO_MENU_MSG_HEIGHT, 0);
   }
   h += 2 * 8;
   y = 3 * screen_height / 5 - h / 2;

   /* calculate the width of the whole menu */
   w = 0;
   for (i = 0; menu[i].proc != NULL; i++) {
      tmp = menu[i].proc(&menu[i], DEMO_MENU_MSG_WIDTH, 0);
      menu[i].w = tmp;
      menu[i].x = (screen_width - tmp) / 2;
      if (tmp > w) {
         w = tmp;
      }
   }
   w += 2 * 8;
   if (w < screen_width / 3) w =  screen_width / 3;
   if (w > screen_width) w = screen_width;
   x = (screen_width - w) / 2;

   /* draw menu background */
   al_draw_filled_rectangle(x, y, x + w, y + h,
      al_map_rgba_f(0.37 * 0.6, 0.42 * 0.6, 0.45 * 0.6, 0.6));
   al_draw_rectangle(x, y, x + w, y + h, al_map_rgb(0, 0, 0), 1);

   /* draw menu items */
   y += 8;
   for (i = 0; menu[i].proc != NULL; i++) {
      menu[i].proc(&menu[i], DEMO_MENU_MSG_DRAW, y);
      menu[i].y = y;
      tmp = menu[i].proc(&menu[i], DEMO_MENU_MSG_HEIGHT, 0);
      menu[i].h = tmp;
      y += tmp;
   }
}